

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  CType *pCVar1;
  TValue *pTVar2;
  uint64_t uVar3;
  CTInfo *pCVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  ushort uVar8;
  IRRef1 IVar9;
  IRType IVar10;
  TRef TVar11;
  TRef TVar12;
  CTSize CVar13;
  CTypeID CVar14;
  GCcdata *pGVar15;
  CType *pCVar16;
  cTValue *pcVar17;
  TRef *pTVar18;
  ushort uVar19;
  ushort uVar20;
  IROpT IVar21;
  uint uVar22;
  uint uVar23;
  CType **ppCVar24;
  ulong uVar25;
  uint *puVar26;
  GCRef GVar27;
  int32_t iVar28;
  IRRef1 IVar29;
  TRef tr;
  CTState *pCVar30;
  GCobj *o;
  uint uVar31;
  bool bVar32;
  uint uVar33;
  ulong uVar34;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  undefined1 local_78 [8];
  CTState *local_70;
  GCRef local_68;
  RecordFFData *local_60;
  CType *local_58 [3];
  CTSize local_3c;
  ulong local_38;
  
  pCVar30 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  GVar27.gcptr64 = (uint64_t)local_78;
  uVar34 = 0;
  ppCVar24 = local_58;
  local_70 = pCVar30;
  local_60 = rd;
  bVar7 = true;
LAB_0015bce3:
  do {
    bVar32 = bVar7;
    uVar33 = J->base[uVar34];
    if (uVar33 == 0) goto LAB_0015c9dd;
    uVar22 = uVar33 & 0x1f000000;
    if (uVar22 == 0) {
      uVar33 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      pCVar16 = pCVar30->tab + 0x11;
    }
    else {
      IVar29 = (IRRef1)uVar33;
      if (uVar22 == 0xa000000) {
        local_68.gcptr64 = GVar27.gcptr64;
        pGVar15 = argv2cdata(J,uVar33,local_60->argv + uVar34);
        local_38 = (ulong)pGVar15->ctypeid;
        pCVar1 = pCVar30->tab;
        uVar33 = pCVar1[local_38].info;
        pCVar16 = pCVar1 + local_38;
        IVar10 = crec_ct2irt(pCVar30,pCVar16);
        pCVar30 = local_70;
        uVar33 = uVar33 >> 0x1c;
        uVar20 = (ushort)IVar10;
        if (uVar33 == 2) {
          (J->fold).ins.field_0.ot = uVar20 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar29;
          (J->fold).ins.field_0.op2 = 0x15;
          uVar33 = lj_opt_fold(J);
          uVar22 = pCVar16->info;
          if ((uVar22 & 0xf0800000) == 0x20800000) {
            uVar23 = uVar22 & 0xffff;
            uVar22 = local_70->tab[uVar23].info;
            pCVar16 = local_70->tab + uVar23;
            IVar10 = crec_ct2irt(local_70,pCVar16);
          }
LAB_0015c0ae:
          if ((uVar22 & 0xf0000000) == 0x50000000) {
            pCVar16 = local_70->tab + (uVar22 & 0xffff);
            uVar22 = pCVar16->info;
          }
          GVar27.gcptr64 = local_68.gcptr64;
          pCVar30 = local_70;
          if (uVar22 < 0x10000000) {
            if (IVar10 == IRT_CDATA) {
              uVar33 = 0;
            }
            else {
              (J->fold).ins.field_0.ot = (ushort)IVar10 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar33;
              (J->fold).ins.field_0.op2 = 0;
              uVar33 = lj_opt_fold(J);
              GVar27.gcptr64 = local_68.gcptr64;
              pCVar30 = local_70;
            }
          }
        }
        else if (IVar10 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar20 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar29;
          (J->fold).ins.field_0.op2 = 0x17;
          uVar33 = lj_opt_fold(J);
          GVar27.gcptr64 = local_68.gcptr64;
          pCVar30 = local_70;
        }
        else {
          if (1 < IVar10 - IRT_INT) {
            if (uVar33 != 6) {
              TVar11 = lj_ir_kint64(J,0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = IVar29;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
              uVar33 = lj_opt_fold(J);
              uVar22 = pCVar16->info;
              goto LAB_0015c0ae;
            }
            if (bVar32) {
              uVar25 = 0;
            }
            else {
              uVar25 = (ulong)(uint)((int)((ulong)((long)local_58[0] - (long)pCVar1) >> 3) *
                                    -0x55555555);
            }
            (J->fold).ins.field_0.op1 = IVar29;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090015;
            TVar11 = lj_opt_fold(J);
            CVar14 = lj_ctype_intern(pCVar30,(uint)local_38 | 0x20030000,8);
            pCVar16 = pCVar30->tab + CVar14;
            if (!bVar32) {
              local_58[0] = pCVar30->tab + uVar25;
              local_58[uVar34] = pCVar16;
              *(TRef *)(local_78 + uVar34 * 4) = TVar11;
              break;
            }
            *ppCVar24 = pCVar16;
            *(TRef *)local_68.gcptr64 = TVar11;
            uVar34 = 1;
            ppCVar24 = local_58 + 1;
            GVar27.gcptr64 = (uint64_t)(local_78 + 4);
            bVar7 = false;
            goto LAB_0015bce3;
          }
          (J->fold).ins.field_0.ot = uVar20 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar29;
          (J->fold).ins.field_0.op2 = 0x16;
          uVar33 = lj_opt_fold(J);
          GVar27.gcptr64 = local_68.gcptr64;
          pCVar30 = local_70;
          if ((pCVar16->info & 0xf0000000) == 0x50000000) {
            pCVar16 = (CType *)((long)&local_70->tab->info +
                               (ulong)((pCVar16->info & 0xffff) * 0x18));
          }
        }
      }
      else {
        pCVar16 = pCVar30->tab;
        if ((uVar33 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar16 = pCVar16 + 9;
        }
        else if (uVar22 == 0xe000000) {
          pCVar16 = pCVar16 + 0xe;
        }
        else if (uVar22 == 0x4000000) {
          local_68.gcptr64 = GVar27.gcptr64;
          pGVar15 = argv2cdata(J,J->base[uVar34 ^ 1],local_60->argv + (uVar34 ^ 1));
          pCVar1 = pCVar30->tab;
          pCVar16 = pCVar1 + pGVar15->ctypeid;
          uVar22 = pCVar1[pGVar15->ctypeid].info >> 0x1c;
          if (uVar22 == 2) {
            TVar11 = lj_ir_kint64(J,0x18);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar29;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
            uVar33 = lj_opt_fold(J);
            GVar27.gcptr64 = local_68.gcptr64;
          }
          else if (uVar22 == 5) {
            o = (GCobj *)(local_60->argv[uVar34].u64 & 0x7fffffffffff);
            pCVar16 = lj_ctype_getfieldq(pCVar30,pCVar16,&o->str,&local_3c,(CTInfo *)0x0);
            if ((pCVar16 == (CType *)0x0) || ((pCVar16->info & 0xf0000000) != 0xb0000000)) {
              pCVar16 = local_70->tab + 0x11;
              GVar27.gcptr64 = local_68.gcptr64;
              pCVar30 = local_70;
            }
            else {
              TVar11 = lj_ir_kgc(J,o,IRT_STR);
              (J->fold).ins.field_0.ot = 0x884;
              (J->fold).ins.field_0.op1 = IVar29;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
              lj_opt_fold(J);
              pCVar30 = local_70;
              pCVar16 = (CType *)((long)&local_70->tab->info +
                                 (ulong)((uint)(ushort)pCVar16->info * 0x18));
              uVar33 = lj_ir_kint(J,local_3c);
              GVar27.gcptr64 = local_68.gcptr64;
            }
          }
          else {
            pCVar16 = pCVar1 + 0x11;
            GVar27.gcptr64 = local_68.gcptr64;
          }
        }
        else {
          pCVar16 = pCVar16 + 0x11;
          uVar33 = 0;
        }
      }
    }
    *ppCVar24 = pCVar16;
    ((CType *)GVar27.gcptr64)->info = uVar33;
    uVar34 = 1;
    GVar27.gcptr64 = (uint64_t)(local_78 + 4);
    ppCVar24 = local_58 + 1;
    bVar7 = false;
  } while (bVar32);
  pCVar16 = local_58[0];
  uVar33 = local_60->data;
  if ((((uVar33 == 5) || (uVar33 == 8)) || (uVar34 = (ulong)(uint)local_78._0_4_, uVar34 == 0)) ||
     (uVar25 = (ulong)(uint)local_78._4_4_, uVar25 == 0)) goto LAB_0015c7ad;
  uVar22 = local_58[0]->info;
  GVar27.gcptr64 = (uint64_t)local_58[1];
  if ((uVar22 < 0x10000000) && (uVar23 = local_58[1]->info, uVar23 < 0x10000000)) {
    if ((((uVar22 >> 0x17 & 1) == 0) || (local_58[0]->size != 8)) &&
       (((uVar23 >> 0x17 & 1) == 0 || (local_58[1]->size != 8)))) {
      uVar20 = 0x15;
      iVar28 = 0xb;
      if (((9 < uVar33) ||
          (((((uVar23 | uVar22) >> 0x1a & 1) != 0 || (local_58[0]->size != 4)) ||
           (local_58[1]->size != 4)))) ||
         (((((uVar23 ^ uVar22) >> 0x17 & 1) != 0 &&
           (((short)local_78._4_4_ < 0 || ((J->cur).ir[local_78._4_4_ & 0x7fff].i < 0)))) &&
          (((short)local_78._0_4_ < 0 ||
           (uVar22 = uVar23, (J->cur).ir[local_78._0_4_ & 0x7fff].i < 0)))))) goto LAB_0015c35a;
      uVar20 = ((uVar22 >> 0x17 & 1) != 0) + 0x13;
    }
    else {
      uVar20 = 0x16;
      iVar28 = 0xc;
LAB_0015c35a:
      local_68.gcptr64 = (uint64_t)local_58[1];
      puVar26 = (uint *)local_78;
      ppCVar24 = local_58;
      bVar7 = true;
      do {
        bVar32 = bVar7;
        uVar22 = *puVar26;
        uVar23 = uVar22 >> 0x18 & 0x1f;
        if (uVar23 - 0xd < 2) {
          uVar19 = (short)uVar23 + uVar20 * 0x20 + 0x1000;
LAB_0015c3c2:
          (J->fold).ins.field_0.ot = uVar20 + 0x5b00;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
          (J->fold).ins.field_0.op2 = uVar19;
          TVar11 = lj_opt_fold(J);
          *puVar26 = TVar11;
        }
        else if (1 < uVar23 - 0x15) {
          uVar19 = ((ushort)((*ppCVar24)->info >> 0xc) & 0x800 | uVar20 * 0x20) ^ 0x813;
          goto LAB_0015c3c2;
        }
        uVar6 = local_78._4_4_;
        uVar5 = local_78._0_4_;
        ppCVar24 = local_58 + 1;
        puVar26 = (uint *)(local_78 + 4);
        bVar7 = false;
      } while (bVar32);
      if (9 < uVar33) {
        uVar34 = (ulong)(uint)local_78._0_4_;
        uVar25 = (ulong)(uint)local_78._4_4_;
        (J->fold).ins.field_0.ot = (short)(uVar33 << 8) + uVar20 + 0x1f00;
        (J->fold).ins.field_0.op1 = (IRRef1)local_78._0_4_;
        (J->fold).ins.field_0.op2 = (IRRef1)local_78._4_4_;
        TVar11 = lj_opt_fold(J);
        TVar12 = lj_ir_kint(J,iVar28);
        (J->fold).ins.field_0.ot = 0x548a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar12;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
        TVar11 = lj_opt_fold(J);
        if (TVar11 != 0) goto LAB_0015c974;
        GVar27.gcptr64 = local_68.gcptr64;
        if (uVar6 == 0 || uVar5 == 0) goto LAB_0015c7ad;
        goto LAB_0015c4d6;
      }
    }
    uVar19 = 0x800;
    if (uVar33 != 4) {
      uVar8 = (ushort)(uVar33 != 6) * 0x200;
      uVar19 = uVar8 + 0x400;
      if ((uVar20 & 0xfffd) != 0x14) {
        uVar19 = uVar8;
      }
    }
    uVar20 = uVar19 | uVar20 | 0x80;
    uVar34 = (ulong)(uint)local_78._0_4_;
    uVar25 = (ulong)(uint)local_78._4_4_;
    goto LAB_0015c94e;
  }
LAB_0015c4d6:
  pCVar30 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  uVar22 = pCVar16->info;
  uVar23 = (uint)uVar34;
  if ((uVar22 & 0xf0000000) == 0x20000000 || (uVar22 & 0xfc000000) == 0x30000000) {
    if (((0xb < uVar33) || ((0x8d0U >> (uVar33 & 0x1f) & 1) == 0)) ||
       ((((CType *)GVar27.gcptr64)->info & 0xf0000000) != 0x20000000 &&
        (((CType *)GVar27.gcptr64)->info & 0xfc000000) != 0x30000000)) {
      if (((uVar33 & 0xfffffffe) == 10) &&
         (pCVar4 = &((CType *)GVar27.gcptr64)->info, uVar34 = uVar25,
         GVar27.gcptr64 = (uint64_t)pCVar16, uVar31 = uVar23, *pCVar4 < 0x10000000))
      goto LAB_0015c658;
      goto LAB_0015c7ad;
    }
    if (uVar33 == 4) {
      uVar20 = 0x889;
    }
    else {
      if (uVar33 == 0xb) {
        CVar13 = lj_ctype_size(pCVar30,uVar22 & 0xffff);
        if ((CVar13 ^ CVar13 - 1) <= CVar13 - 1) goto LAB_0015c7ad;
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar34;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar25;
        TVar11 = lj_opt_fold(J);
        iVar28 = 0x1f;
        if (CVar13 != 0) {
          for (; CVar13 >> iVar28 == 0; iVar28 = iVar28 + -1) {
          }
        }
        TVar12 = lj_ir_kint(J,iVar28);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar12;
        TVar11 = lj_opt_fold(J);
        IVar9 = (IRRef1)TVar11;
        IVar29 = 0x1d5;
        IVar21 = 0x5b0e;
        goto LAB_0015c77f;
      }
      uVar20 = (ushort)(uVar33 != 6) << 9 | 0x489;
    }
  }
  else {
    if ((uVar22 < 0x10000000 && uVar33 == 10) &&
       (uVar22 = ((CType *)GVar27.gcptr64)->info,
       (uVar22 & 0xf0000000) == 0x20000000 || (uVar22 & 0xfc000000) == 0x30000000)) {
      uVar31 = (uint)uVar25;
      local_78._0_4_ = uVar31;
      local_78._4_4_ = uVar23;
LAB_0015c658:
      uVar23 = (uint)(uVar34 >> 0x18) & 0x1f;
      CVar13 = lj_ctype_size(pCVar30,uVar22 & 0xffff);
      if (uVar23 - 0xd < 2) {
        IVar29 = (ushort)uVar23 | 0x12a0;
LAB_0015c6d3:
        (J->fold).ins.field_0.ot = 0x5b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar34;
        (J->fold).ins.field_0.op2 = IVar29;
        TVar11 = lj_opt_fold(J);
        uVar34 = (ulong)TVar11;
      }
      else if (1 < uVar23 - 0x15) {
        IVar29 = (ushort)(uVar34 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_0015c6d3;
      }
      TVar11 = lj_ir_kint64(J,(ulong)CVar13);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar34;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
      TVar11 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar33 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar31;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
      TVar11 = lj_opt_fold(J);
      IVar29 = (IRRef1)TVar11;
      CVar14 = lj_ctype_intern(pCVar30,(ushort)((CType *)GVar27.gcptr64)->info | 0x20030000,8);
      TVar11 = lj_ir_kint(J,CVar14);
      IVar9 = (IRRef1)TVar11;
      IVar21 = 0x548a;
LAB_0015c77f:
      (J->fold).ins.field_0.ot = IVar21;
      (J->fold).ins.field_0.op1 = IVar9;
      (J->fold).ins.field_0.op2 = IVar29;
      TVar11 = lj_opt_fold(J);
      if (TVar11 != 0) goto LAB_0015c974;
    }
LAB_0015c7ad:
    pCVar30 = local_70;
    pTVar18 = J->base;
    if (*pTVar18 != 0) {
      if ((local_60->argv->field_4).it >> 0xf == 0x1fff5) {
        pGVar15 = argv2cdata(J,*pTVar18,local_60->argv);
        uVar33 = pCVar30->tab[pGVar15->ctypeid].info;
        uVar22 = (uint)pGVar15->ctypeid;
        if ((uVar33 & 0xf0000000) == 0x20000000) {
          uVar22 = uVar33 & 0xffff;
        }
        pcVar17 = lj_ctype_meta(pCVar30,uVar22,local_60->data);
        if (pcVar17 == (cTValue *)0x0) {
          pTVar18 = J->base;
          goto LAB_0015c836;
        }
LAB_0015c8ad:
        if ((pcVar17->u64 & 0xffff800000000000) == 0xfffb800000000000) {
          TVar11 = lj_ir_kgc(J,(GCobj *)(pcVar17->u64 & 0x7fffffffffff),IRT_FUNC);
          pTVar18 = J->base;
          pTVar18[-2] = TVar11;
          pTVar18[-1] = 0x10000;
          local_60->nres = -1;
          return;
        }
        goto LAB_0015c9dd;
      }
LAB_0015c836:
      if ((pTVar18[1] != 0) && ((local_60->argv[1].u64 & 0xffff800000000000) == 0xfffa800000000000))
      {
        pGVar15 = argv2cdata(J,pTVar18[1],local_60->argv + 1);
        uVar33 = pCVar30->tab[pGVar15->ctypeid].info;
        uVar22 = (uint)pGVar15->ctypeid;
        if ((uVar33 & 0xf0000000) == 0x20000000) {
          uVar22 = uVar33 & 0xffff;
        }
        pcVar17 = lj_ctype_meta(pCVar30,uVar22,local_60->data);
        if (pcVar17 != (cTValue *)0x0) goto LAB_0015c8ad;
      }
    }
    if (local_60->data != 4) {
LAB_0015c9dd:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar34 = (ulong)(uint)local_78._0_4_;
    TVar11 = 0x1007ffe;
    if (((local_78._0_4_ == 0) || (uVar25 = (ulong)(uint)local_78._4_4_, local_78._4_4_ == 0)) ||
       (uVar20 = 0x889, 0xfffffff < local_58[1]->info == local_58[0]->info < 0x10000000))
    goto LAB_0015c974;
  }
LAB_0015c94e:
  (J->fold).ins.field_0.ot = uVar20;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar34;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar25;
  J->postproc = LJ_POST_FIXGUARD;
  TVar11 = 0x2007ffd;
LAB_0015c974:
  *J->base = TVar11;
  if (((J->postproc == LJ_POST_FIXGUARD) && (pTVar2 = J->L->base, (pTVar2[-1].u32.lo & 7) == 2)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar3 = pTVar2[-3].u64, (*(uint *)(uVar3 - 4) & 0xfc) < 0xc)))) {
    *(uint64_t *)&J[-1].penalty[0x31].val = uVar3 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}